

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O2

int Ivy_ManSeqFindCut_int(Ivy_Man_t *p,Vec_Int_t *vFront,Vec_Int_t *vInside,int nSizeLimit)

{
  int *piVar1;
  int iVar2;
  Ivy_Obj_t *pIVar3;
  long lVar4;
  long lVar5;
  char *__function;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  char *__assertion;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint local_7c;
  int LeavesBest [10];
  
  uVar6 = 0xffffffff;
  local_7c = 99;
  for (lVar5 = 0; lVar5 < vFront->nSize; lVar5 = lVar5 + 1) {
    uVar11 = vFront->pArray[lVar5];
    if ((int)uVar11 < 1) {
      __assertion = "Leaf > 0";
      __function = "int Ivy_NodeGetLeafCostOne(Ivy_Man_t *, int, Vec_Int_t *)";
      uVar6 = 0x35;
      goto LAB_0061fab5;
    }
    pIVar3 = Ivy_ManObj(p,uVar11 >> 8);
    uVar12 = *(uint *)&pIVar3->field_0x8 & 0xf;
    uVar8 = 999;
    if (((uVar12 != 1) && (pIVar3->Id != 0)) &&
       (uVar10 = (uint)(uVar12 == 4) + (uVar11 & 0xff), uVar10 < 0x10)) {
      uVar8 = 0;
      uVar9 = 0;
      if (pIVar3->pFanin0 != (Ivy_Obj_t *)0x0) {
        uVar9 = *(int *)((ulong)pIVar3->pFanin0 & 0xfffffffffffffffe) << 8;
      }
      if ((uVar9 | uVar10) != 0) {
        iVar2 = Vec_IntFind(vInside,uVar9 | uVar10);
        uVar8 = (uint)(iVar2 == -1);
      }
      if ((uVar12 != 4) && (uVar12 != 7)) {
        if (uVar12 - 7 < 0xfffffffe) {
          __assertion = "Ivy_ObjIsNode(pNode)";
          __function = "int Ivy_NodeGetLeafCostOne(Ivy_Man_t *, int, Vec_Int_t *)";
          uVar6 = 0x45;
          goto LAB_0061fab5;
        }
        uVar12 = 0;
        uVar9 = 0;
        if (pIVar3->pFanin1 != (Ivy_Obj_t *)0x0) {
          uVar9 = *(int *)((ulong)pIVar3->pFanin1 & 0xfffffffffffffffe) << 8;
        }
        if ((uVar9 | uVar10) != 0) {
          iVar2 = Vec_IntFind(vInside,uVar9 | uVar10);
          uVar12 = (uint)(iVar2 == -1);
        }
        uVar8 = uVar8 + uVar12;
      }
    }
    if (uVar8 < local_7c) {
      LeavesBest[0] = uVar11;
      if (uVar8 < 2) {
        if (nSizeLimit < (int)(vFront->nSize + uVar8 + -1)) {
          return 0;
        }
        uVar6 = 1;
        goto LAB_0061f91b;
      }
      uVar6 = 1;
      local_7c = uVar8;
    }
    else if (local_7c == uVar8) {
      lVar4 = (long)(int)uVar6;
      uVar6 = uVar6 + 1;
      LeavesBest[lVar4] = uVar11;
    }
  }
  if (local_7c == 99) {
    return 0;
  }
  if (2 < local_7c) {
    __assertion = "CostBest < 3";
    __function = "int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)";
    uVar6 = 0x7d;
LAB_0061fab5:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                  ,uVar6,__function);
  }
  if (nSizeLimit < vFront->nSize + 1) {
    return 0;
  }
  if ((int)uVar6 < 1) {
    __assert_fail("Counter > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                  ,0x82,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
LAB_0061f91b:
  uVar7 = 0;
  printf("%d",(ulong)uVar6);
  iVar2 = rand();
  uVar6 = LeavesBest[iVar2 % (int)uVar6];
  if ((int)uVar6 < 0) {
    __assert_fail("LeafBest >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                  ,0x88,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  uVar11 = vFront->nSize;
  if (0 < (int)uVar11) {
    uVar7 = (ulong)uVar11;
  }
  for (lVar5 = 1; lVar5 - uVar7 != 1; lVar5 = lVar5 + 1) {
    piVar1 = vFront->pArray;
    if (piVar1[lVar5 + -1] == uVar6) goto LAB_0061f97c;
  }
  if ((int)uVar11 < 0) {
    __assert_fail("i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x3dc,"int Vec_IntRemove(Vec_Int_t *, int)");
  }
LAB_0061f990:
  pIVar3 = Ivy_ManObj(p,uVar6 >> 8);
  uVar11 = *(uint *)&pIVar3->field_0x8 & 0xf;
  if ((uVar11 != 7) && (uVar11 - 5 < 2 == (uVar11 == 4))) {
    __assert_fail("Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                  ,0x8f,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
  }
  uVar6 = (uint)(uVar11 == 4) + (uVar6 & 0xff);
  if (pIVar3->pFanin0 == (Ivy_Obj_t *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(int *)((ulong)pIVar3->pFanin0 & 0xfffffffffffffffe) << 8;
  }
  uVar8 = uVar8 | uVar6;
  if ((uVar8 != 0) && (iVar2 = Vec_IntFind(vInside,uVar8), iVar2 == -1)) {
    Vec_IntPush(vFront,uVar8);
    Vec_IntPush(vInside,uVar8);
    uVar11 = *(uint *)&pIVar3->field_0x8 & 0xf;
  }
  if ((uVar11 != 4) && (uVar11 != 7)) {
    if (uVar11 - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                    ,0x9d,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
    }
    if (pIVar3->pFanin1 == (Ivy_Obj_t *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(int *)((ulong)pIVar3->pFanin1 & 0xfffffffffffffffe) << 8;
    }
    uVar11 = uVar11 | uVar6;
    if ((uVar11 != 0) && (iVar2 = Vec_IntFind(vInside,uVar11), iVar2 == -1)) {
      Vec_IntPush(vFront,uVar11);
      Vec_IntPush(vInside,uVar11);
    }
    if (nSizeLimit < vFront->nSize) {
      __assert_fail("Vec_IntSize(vFront) <= nSizeLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyCut.c"
                    ,0xa7,"int Ivy_ManSeqFindCut_int(Ivy_Man_t *, Vec_Int_t *, Vec_Int_t *, int)");
    }
  }
  return 1;
LAB_0061f97c:
  for (; (int)lVar5 < (int)uVar11; lVar5 = lVar5 + 1) {
    piVar1[lVar5 + -1] = piVar1[lVar5];
    uVar11 = vFront->nSize;
  }
  vFront->nSize = uVar11 - 1;
  goto LAB_0061f990;
}

Assistant:

int Ivy_ManSeqFindCut_int( Ivy_Man_t * p, Vec_Int_t * vFront, Vec_Int_t * vInside, int nSizeLimit )
{
    Ivy_Obj_t * pNode;
    int CostBest, CostCur, Leaf, LeafBest, Next, nLatches, i;
    int LeavesBest[10];
    int Counter;

    // add random selection of the best fanin!!!

    // find the best fanin
    CostBest = 99;
    LeafBest = -1;
    Counter = -1;
//printf( "Evaluating fanins of the cut:\n" );
    Vec_IntForEachEntry( vFront, Leaf, i )
    {
        CostCur = Ivy_NodeGetLeafCostOne( p, Leaf, vInside );
//printf( "    Fanin %s has cost %d.\n", Ivy_ObjName(pNode), CostCur );
        if ( CostBest > CostCur )
        {
            CostBest = CostCur;
            LeafBest = Leaf;
            LeavesBest[0] = Leaf;
            Counter = 1;
        }
        else if ( CostBest == CostCur )
            LeavesBest[Counter++] = Leaf;

        if ( CostBest <= 1 ) // can be if ( CostBest <= 1 )
            break;
    }
    if ( CostBest == 99 )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( CostBest < 3 );
    if ( Vec_IntSize(vFront) - 1 + CostBest > nSizeLimit )
        return 0;
//        return Ivy_NodeBuildCutLevelTwo_int( vInside, vFront, nFaninLimit );

    assert( Counter > 0 );
printf( "%d", Counter );

    LeafBest = LeavesBest[rand() % Counter];

    // remove the node from the array
    assert( LeafBest >= 0 );
    Vec_IntRemove( vFront, LeafBest );
//printf( "Removing fanin %s.\n", Ivy_ObjName(pNode) );

    // get the node and its latches
    pNode = Ivy_ManObj( p, Ivy_LeafId(LeafBest) );
    nLatches = Ivy_LeafLat(LeafBest) + Ivy_ObjIsLatch(pNode);
    assert( Ivy_ObjIsNode(pNode) || Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) );

    // add the left child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId0(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }

    // quit if this is the one fanin node
    if ( Ivy_ObjIsLatch(pNode) || Ivy_ObjIsBuf(pNode) )
        return 1;
    assert( Ivy_ObjIsNode(pNode) );

    // add the right child to the fanins
    Next = Ivy_LeafCreate( Ivy_ObjFaninId1(pNode), nLatches );
    if ( Next && Vec_IntFind(vInside, Next) == -1 )
    {
//printf( "Adding fanin %s.\n", Ivy_ObjName(pNext) );
        Vec_IntPush( vFront, Next );
        Vec_IntPush( vInside, Next );
    }
    assert( Vec_IntSize(vFront) <= nSizeLimit );
    // keep doing this
    return 1;
}